

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-generated-function-mockers.h
# Opt level: O1

MockSpec<unsigned_char_(unsigned_short)> * __thiscall
testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::With
          (MockSpec<unsigned_char_(unsigned_short)> *__return_storage_ptr__,
          FunctionMocker<unsigned_char_(unsigned_short)> *this,Matcher<unsigned_short> *m1)

{
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_> local_38;
  
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::linked_ptr
            (&local_38,&(m1->super_MatcherBase<unsigned_short>).impl_);
  __return_storage_ptr__->function_mocker_ =
       &this->super_FunctionMockerBase<unsigned_char_(unsigned_short)>;
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001addc8;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::linked_ptr
            (&(__return_storage_ptr__->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
              super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
              super_MatcherBase<unsigned_short>.impl_,&local_38);
  (__return_storage_ptr__->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_short>_>.
  super__Head_base<0UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
  super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001add80;
  linked_ptr<const_testing::MatcherInterface<const_unsigned_short_&>_>::~linked_ptr(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(const Matcher<A1>& m1) {
    return MockSpec<F>(this, ::testing::make_tuple(m1));
  }